

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# distortion.cc
# Opt level: O1

void gmath::Distortion::cleanAllProperties(Properties *prop,int id)

{
  RadialTangentialDistortion *this;
  RadialDistortion rd;
  EquidistantDistortion ed;
  RadialTangentialDistortion rtd;
  undefined1 auStack_98 [80];
  RadialTangentialDistortion local_48;
  
  this = (RadialTangentialDistortion *)auStack_98;
  EquidistantDistortion::EquidistantDistortion((EquidistantDistortion *)(auStack_98 + 0x28));
  RadialTangentialDistortion::RadialTangentialDistortion(&local_48,3);
  RadialDistortion::RadialDistortion((RadialDistortion *)auStack_98,3);
  EquidistantDistortion::cleanProperties((EquidistantDistortion *)this,prop,id);
  RadialTangentialDistortion::cleanProperties(this,prop,id);
  RadialDistortion::cleanProperties((RadialDistortion *)this,prop,id);
  return;
}

Assistant:

void Distortion::cleanAllProperties(gutil::Properties &prop, int id)
{
  EquidistantDistortion ed;
  RadialTangentialDistortion rtd(3);
  RadialDistortion rd(3);

  ed.cleanProperties(prop, id);
  rtd.cleanProperties(prop, id);
  rd.cleanProperties(prop, id);
}